

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queueTest.cpp
# Opt level: O2

void print<ft::queue<int,ft::list<int,ft::allocator<int>>>>
               (queue<int,_ft::list<int,_ft::allocator<int>_>_> *t,char *s)

{
  ostream *poVar1;
  
  *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 3;
  poVar1 = std::operator<<((ostream *)&std::cout,s);
  std::operator<<(poVar1," contains:");
  while ((t->c).m_size != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,' ');
    std::ostream::operator<<(poVar1,((t->c).m_head)->next->data);
    ft::list<int,_ft::allocator<int>_>::pop_front(&t->c);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void	print(T & t, char const * s) {
	std::cout << std::setw(3) << s << " contains:";
	while (!t.empty()) {
		std::cout << ' ' << t.front();
		t.pop();
	}
	std::cout << std::endl;
}